

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O0

void __thiscall
imrt::Collimator::Collimator
          (Collimator *this,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *coord_files)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  runtime_error *this_00;
  istream *piVar6;
  char *pcVar7;
  vector<double,_std::allocator<double>_> *this_01;
  mapped_type *pmVar8;
  map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
  *pmVar9;
  reference pvVar10;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RSI;
  long in_RDI;
  map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
  *coord;
  Collimator *this_02;
  value_type_conflict1 *__x;
  pair<double,_double> pVar11;
  int j;
  int angle;
  int i;
  bool flag;
  double y;
  double x;
  stringstream ss;
  string linec;
  string line;
  ifstream myfile;
  undefined4 in_stack_fffffffffffffa58;
  mapped_type in_stack_fffffffffffffa5c;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
  *in_stack_fffffffffffffa60;
  mapped_type *in_stack_fffffffffffffa68;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffa70;
  iterator in_stack_fffffffffffffa78;
  undefined7 in_stack_fffffffffffffa98;
  byte in_stack_fffffffffffffa9f;
  map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
  *in_stack_fffffffffffffaa0;
  mapped_type *in_stack_fffffffffffffac8;
  Collimator *in_stack_fffffffffffffad0;
  const_iterator __position;
  int local_454;
  _Self local_430;
  _Self local_428;
  value_type_conflict1 *local_420;
  double local_418;
  int local_40c;
  int local_408;
  byte local_401;
  double local_400;
  double local_3f8;
  long local_3f0 [49];
  string local_268 [32];
  string local_248 [48];
  string local_218 [520];
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_10;
  
  local_10 = in_RSI;
  std::
  map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::map((map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
         *)0x1560d7);
  std::
  map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
  ::map((map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
         *)0x1560f0);
  coord = (map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
           *)(in_RDI + 0x60);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x156109);
  this_02 = (Collimator *)(in_RDI + 0x78);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x156122);
  std::
  map<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ::map((map<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
         *)0x15613e);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x15615a)
  ;
  std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)0x156176);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x156192);
  std::
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  ::map((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
         *)0x1561ae);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1561ca);
  std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::map
            ((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> *)
             0x1561e6);
  std::ifstream::ifstream(local_218);
  std::__cxx11::string::string(local_248);
  std::__cxx11::string::string(local_268);
  std::__cxx11::stringstream::stringstream((stringstream *)local_3f0);
  local_408 = 0;
  while( true ) {
    uVar3 = (ulong)local_408;
    sVar4 = std::
            vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size(local_10);
    if (sVar4 <= uVar3) {
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60));
      *(int *)(in_RDI + 0x94) = (int)sVar4;
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x78));
      *(int *)(in_RDI + 0x98) = (int)sVar4;
      *(int *)(in_RDI + 0x90) = *(int *)(in_RDI + 0x94) * *(int *)(in_RDI + 0x98);
      setActiveBeamlets(this_02,coord);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3f0);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::string::~string(local_248);
      std::ifstream::~ifstream(local_218);
      return;
    }
    pvVar5 = std::
             vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_10,(long)local_408);
    local_40c = pvVar5->first;
    std::__cxx11::list<int,_std::allocator<int>_>::push_back
              ((list<int,_std::allocator<int>_> *)in_stack_fffffffffffffa70._M_current,
               (value_type_conflict2 *)in_stack_fffffffffffffa68);
    pvVar5 = std::
             vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_10,(long)local_408);
    std::ifstream::open(local_218,(int)pvVar5 + _S_in);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) break;
    while( true ) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_218,local_248);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
      if (!bVar2) break;
      local_401 = 0;
      std::ios::clear((long)local_3f0 + *(long *)(local_3f0[0] + -0x18),0);
      std::__cxx11::stringstream::str((string *)local_3f0);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_3f0,local_268,'\t');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_3f0,local_268,'\t');
      __position._M_current = (double *)local_268;
      pcVar7 = (char *)std::__cxx11::string::c_str();
      local_3f8 = atof(pcVar7);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_3f0,(string *)__position._M_current,'\t');
      pcVar7 = (char *)std::__cxx11::string::c_str();
      local_400 = atof(pcVar7);
      this_01 = (vector<double,_std::allocator<double>_> *)
                std::
                map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
                ::operator[]((map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
                              *)in_stack_fffffffffffffaa0,
                             (key_type_conflict *)
                             CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
      pVar11 = std::make_pair<double&,double&>
                         ((double *)in_stack_fffffffffffffa60,
                          (double *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      local_418 = pVar11.second;
      __x = (value_type_conflict1 *)pVar11.first;
      local_420 = __x;
      std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::push_back
                (in_stack_fffffffffffffa60,
                 (value_type *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      local_428._M_node =
           (_Base_ptr)
           std::
           map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
           ::find((map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                  (key_type_conflict1 *)0x156565);
      local_430._M_node =
           (_Base_ptr)
           std::
           map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
           ::end((map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      bVar2 = std::operator==(&local_428,&local_430);
      if (bVar2) {
        in_stack_fffffffffffffad0 =
             (Collimator *)
             std::
             map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
             ::operator[](in_stack_fffffffffffffaa0,
                          (key_type_conflict1 *)
                          CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa70._M_current,
                   (value_type_conflict1 *)in_stack_fffffffffffffa68);
        insertXorder(in_stack_fffffffffffffad0,(double)in_stack_fffffffffffffac8);
        insertYorder(in_stack_fffffffffffffad0,(double)in_stack_fffffffffffffac8);
      }
      else {
        in_stack_fffffffffffffac8 =
             std::
             map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
             ::operator[](in_stack_fffffffffffffaa0,
                          (key_type_conflict1 *)
                          CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
        std::vector<double,_std::allocator<double>_>::begin
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
        std::
        map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator[](in_stack_fffffffffffffaa0,
                     (key_type_conflict1 *)
                     CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
        std::vector<double,_std::allocator<double>_>::end
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
        std::
        find<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                  ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                   in_stack_fffffffffffffa78._M_current,in_stack_fffffffffffffa70,
                   (double *)in_stack_fffffffffffffa68);
        std::
        map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator[](in_stack_fffffffffffffaa0,
                     (key_type_conflict1 *)
                     CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
        std::vector<double,_std::allocator<double>_>::end
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            *)in_stack_fffffffffffffa60,
                           (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
        if (bVar2) {
          local_401 = 1;
        }
        local_454 = 0;
        while( true ) {
          in_stack_fffffffffffffaa0 =
               (map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                *)(long)local_454;
          pmVar8 = std::
                   map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                   ::operator[](in_stack_fffffffffffffaa0,
                                (key_type_conflict1 *)
                                CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
          pmVar9 = (map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                    *)std::vector<double,_std::allocator<double>_>::size(pmVar8);
          in_stack_fffffffffffffa9f = 0;
          if (in_stack_fffffffffffffaa0 < pmVar9) {
            in_stack_fffffffffffffa9f = local_401 ^ 0xff;
          }
          if ((in_stack_fffffffffffffa9f & 1) == 0) break;
          pmVar8 = std::
                   map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                   ::operator[](in_stack_fffffffffffffaa0,
                                (key_type_conflict1 *)
                                CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pmVar8,(long)local_454)
          ;
          if (local_400 < *pvVar10) {
            std::
            map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
            ::operator[](in_stack_fffffffffffffaa0,
                         (key_type_conflict1 *)
                         CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
            std::
            map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
            ::operator[](in_stack_fffffffffffffaa0,
                         (key_type_conflict1 *)
                         CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
            std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
            __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
            operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                      in_stack_fffffffffffffa68,(difference_type)in_stack_fffffffffffffa60);
            __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
            __normal_iterator<double*>
                      ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)in_stack_fffffffffffffa60,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
            in_stack_fffffffffffffa78 =
                 std::vector<double,_std::allocator<double>_>::insert(this_01,__position,__x);
            local_401 = 1;
          }
          local_454 = local_454 + 1;
        }
        if ((local_401 & 1) == 0) {
          in_stack_fffffffffffffa70._M_current =
               (double *)
               std::
               map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
               ::operator[](in_stack_fffffffffffffaa0,
                            (key_type_conflict1 *)
                            CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa70._M_current
                     ,(value_type_conflict1 *)in_stack_fffffffffffffa68);
        }
        insertYorder(in_stack_fffffffffffffad0,(double)in_stack_fffffffffffffac8);
      }
    }
    std::ifstream::close();
    in_stack_fffffffffffffa68 =
         std::
         map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
         ::operator[]((map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
                       *)in_stack_fffffffffffffaa0,
                      (key_type_conflict *)
                      CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
    sVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            size(in_stack_fffffffffffffa68);
    in_stack_fffffffffffffa5c = (mapped_type)sVar4;
    in_stack_fffffffffffffa60 =
         (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator[]
                   ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                    in_stack_fffffffffffffaa0,
                    (key_type_conflict *)
                    CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
    *(mapped_type *)
     &(in_stack_fffffffffffffa60->
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
      _M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffffa5c;
    local_408 = local_408 + 1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"error reading file.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Collimator::Collimator(vector < pair<int, string> >& coord_files) {
    ifstream myfile;
    string line, linec;
    stringstream ss;
    double x, y;
    bool flag;

    //nb_angles=coord_files.size();

    for (int i=0 ; i < coord_files.size(); i++) {
      // Open file
      int angle = coord_files[i].first;
      angles.push_back(angle);
      myfile.open(coord_files[i].second);
      if (!myfile.is_open())
        throw runtime_error("error reading file.");

      // Read lines of the file
      while (getline (myfile,line)) {
        flag=false;
        ss.clear(); ss.str(line);
        getline (ss,linec,'\t'); //the first number is discarded (beamlet id)
        getline (ss,linec,'\t');
        x = atof(linec.c_str());
        getline (ss,linec,'\t');
        y = atof(linec.c_str());


        angle_coord[angle].push_back(make_pair(x,y));

        if (beam_coord.find(x) == beam_coord.end()) {
          // New x coordinate
          beam_coord[x].push_back(y);
          insertXorder(x);
          insertYorder(y);
        } else {
          if (find(beam_coord[x].begin(), beam_coord[x].end(), y) != beam_coord[x].end())
            flag=true;
          // New y coordinate: insert in order
          for (int j=0; j < beam_coord[x].size() && !flag; j++) {
            if (beam_coord[x][j] > y) {
              beam_coord[x].insert(beam_coord[x].begin()+j, y);
              flag=true;
            }
          }
          if (!flag) beam_coord[x].push_back(y);
          insertYorder(y);
        }
      }
      myfile.close();
      nb_angle_beamlets[angle]=(angle_coord[angle].size());
    }
    xdim = xcoord.size();
    ydim = ycoord.size();
    nb_beamlets= xdim*ydim;
    //printCoordinates();

    setActiveBeamlets(angle_coord);
    //printActiveBeam();
  }